

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

bool __thiscall JsrtDebugManager::CanHalt(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  code *pcVar1;
  bool bVar2;
  int byteCodeOffset;
  undefined4 *puVar3;
  FunctionBody *this_00;
  StatementMap *sourceSpan;
  byte local_32;
  byte local_31;
  StatementMap *map;
  int byteOffset;
  FunctionBody *pCurrentFuncBody;
  InterpreterHaltState *haltState_local;
  JsrtDebugManager *this_local;
  
  bVar2 = Js::InterpreterHaltState::IsValid(haltState);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x54,"(haltState->IsValid())","haltState->IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = Js::InterpreterHaltState::GetFunction(haltState);
  byteCodeOffset = Js::InterpreterHaltState::GetCurrentOffset(haltState);
  sourceSpan = Js::FunctionBody::GetMatchingStatementMapFromByteCode(this_00,byteCodeOffset,false);
  local_31 = 0;
  if (sourceSpan != (StatementMap *)0x0) {
    bVar2 = Js::ParseableFunctionInfo::GetIsGlobalFunc(&this_00->super_ParseableFunctionInfo);
    local_32 = 1;
    if (bVar2) {
      bVar2 = Js::FunctionBody::IsDummyGlobalRetStatement(&sourceSpan->sourceSpan);
      local_32 = bVar2 ^ 0xff;
    }
    local_31 = local_32;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool JsrtDebugManager::CanHalt(Js::InterpreterHaltState* haltState)
{
    // This is registered as the callback for inline breakpoints.
    // We decide here if we are at a reasonable stop location that has source code.
    Assert(haltState->IsValid());

    Js::FunctionBody* pCurrentFuncBody = haltState->GetFunction();
    int byteOffset = haltState->GetCurrentOffset();
    Js::FunctionBody::StatementMap* map = pCurrentFuncBody->GetMatchingStatementMapFromByteCode(byteOffset, false);

    // Resolve the dummy ret code.
    return map != nullptr && (!pCurrentFuncBody->GetIsGlobalFunc() || !Js::FunctionBody::IsDummyGlobalRetStatement(&map->sourceSpan));
}